

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsharedpointer.cpp
# Opt level: O1

void QtSharedPointer::internalSafetyCheckAdd(void *d_ptr,void *ptr)

{
  QHash<const_void_*,_(anonymous_namespace)::Data> *this;
  __pointer_type copy_00;
  Data *this_00;
  Data *this_01;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *pQVar1;
  Type *this_02;
  Node<const_volatile_void_*,_const_void_*> *pNVar2;
  void **ppvVar3;
  long lVar4;
  void *pvVar5;
  long lVar6;
  long lVar7;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *in_RSI;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *in_RDI;
  long in_FS_OFFSET;
  bool bVar8;
  Data data;
  void *copy;
  Data local_68;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_60;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_58;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *local_50;
  undefined1 local_48 [16];
  undefined4 local_38;
  undefined4 uStack_34;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_60 = in_RSI;
  local_58 = in_RDI;
  this_02 = QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_>::
            operator()(in_RDI);
  if (this_02 == (Type *)0x0) goto LAB_00391fe8;
  if (local_60 ==
      (QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> *)0x0) {
    local_60 = local_58;
  }
  if ((this_02->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0) {
    LOCK();
    bVar8 = (this_02->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar8) {
      (this_02->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar8) goto LAB_00391ef8;
  }
  else {
LAB_00391ef8:
    QBasicMutex::lockInternal((QBasicMutex *)this_02);
  }
  this_00 = (this_02->dataPointers).d;
  if ((this_00 == (Data *)0x0) ||
     (pNVar2 = QHashPrivate::Data<QHashPrivate::Node<void_const_volatile*,void_const*>>::
               findNode<void_const_volatile*>
                         ((Data<QHashPrivate::Node<void_const_volatile*,void_const*>> *)this_00,
                          &local_60), pNVar2 == (Node<const_volatile_void_*,_const_void_*> *)0x0)) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = &pNVar2->value;
  }
  pQVar1 = local_60;
  if (ppvVar3 == (void **)0x0) {
    pvVar5 = (void *)0x0;
  }
  else {
    pvVar5 = *ppvVar3;
  }
  if (pvVar5 != (void *)0x0) {
    local_48._0_4_ = 2;
    local_48._4_4_ = 0;
    local_48._8_4_ = 0;
    local_48._12_4_ = 0;
    local_38._0_1_ = false;
    local_38._1_3_ = 0;
    uStack_34 = 0;
    local_30 = "default";
    QMessageLogger::fatal
              ((QMessageLogger *)local_48,
               "QSharedPointer: internal self-check failed: pointer %p was already tracked by another QSharedPointer object %p"
               ,local_60);
  }
  local_68.pointer = local_60;
  this = &this_02->dPointers;
  local_50 = local_58;
  this_01 = (this_02->dPointers).d;
  local_48._4_4_ = (undefined4)((ulong)this_01 >> 0x20);
  if (this_01 == (Data *)0x0) {
LAB_00391f95:
    local_48._0_4_ = SUB84(this_01,0);
    QHash<const_void_*,_(anonymous_namespace)::Data>::detach(this);
    QHash<void_const*,(anonymous_namespace)::Data>::
    emplace_helper<(anonymous_namespace)::Data_const&>
              ((QHash<void_const*,(anonymous_namespace)::Data> *)this,&local_50,&local_68);
    QHash<const_void_*,_(anonymous_namespace)::Data>::~QHash
              ((QHash<const_void_*,_(anonymous_namespace)::Data> *)local_48);
  }
  else {
    if (1 < (uint)(this_01->ref).atomic._q_value.super___atomic_base<int>._M_i) {
      if ((this_01->ref).atomic._q_value.super___atomic_base<int>._M_i != -1) {
        LOCK();
        (this_01->ref).atomic._q_value.super___atomic_base<int>._M_i =
             (this_01->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      goto LAB_00391f95;
    }
    if (this_01->size < this_01->numBuckets >> 1) {
      QHash<void_const*,(anonymous_namespace)::Data>::
      emplace_helper<(anonymous_namespace)::Data_const&>
                ((QHash<void_const*,(anonymous_namespace)::Data> *)this,&local_50,&local_68);
    }
    else {
      local_38._0_1_ = true;
      local_38._1_3_ = 0xaaaaaa;
      uStack_34 = 0xaaaaaaaa;
      local_48._0_4_ = -0x55555556;
      local_48._4_4_ = -0x55555556;
      local_48._8_4_ = 0xaaaaaaaa;
      local_48._12_4_ = 0xaaaaaaaa;
      QHashPrivate::Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>>::
      findOrInsert<void_const*>
                ((InsertionResult *)local_48,
                 (Data<QHashPrivate::Node<void_const*,(anonymous_namespace)::Data>> *)this_01,
                 &local_50);
      if (local_38._0_1_ == false) {
        lVar6 = *(long *)(CONCAT44(local_48._4_4_,local_48._0_4_) + 0x20);
        lVar7 = (CONCAT44(local_48._12_4_,local_48._8_4_) >> 7) * 0x90;
        lVar4 = *(long *)(lVar6 + 0x80 + lVar7);
        lVar6 = (ulong)*(byte *)((ulong)(local_48._8_4_ & 0x7f) + lVar6 + lVar7) * 0x10;
        *(QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> **)
         (lVar4 + lVar6) = local_58;
      }
      else {
        lVar6 = *(long *)(CONCAT44(local_48._4_4_,local_48._0_4_) + 0x20);
        lVar7 = (CONCAT44(local_48._12_4_,local_48._8_4_) >> 7) * 0x90;
        lVar4 = *(long *)(lVar6 + 0x80 + lVar7);
        lVar6 = (ulong)*(byte *)((ulong)(local_48._8_4_ & 0x7f) + lVar6 + lVar7) << 4;
      }
      *(QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_knownPointers>_> **)
       (lVar4 + 8 + lVar6) = pQVar1;
    }
  }
  local_48._0_4_ = SUB84(local_60,0);
  local_48._4_4_ = (undefined4)((ulong)local_60 >> 0x20);
  QHash<void_const_volatile*,void_const*>::emplace<void_const*const&>
            ((QHash<void_const_volatile*,void_const*> *)&this_02->dataPointers,(void **)local_48,
             &local_58);
  LOCK();
  copy_00 = (this_02->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p;
  (this_02->mutex).super_QBasicMutex.d_ptr._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (copy_00 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex((QBasicMutex *)this_02,copy_00);
  }
LAB_00391fe8:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_28) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QtSharedPointer::internalSafetyCheckAdd(const void *d_ptr, const volatile void *ptr)
{
    KnownPointers *const kp = knownPointers();
    if (!kp)
        return;                 // end-game: the application is being destroyed already

    if (!ptr) {
        // nullptr is allowed to be tracked by more than one QSharedPointer, so we
        // need something else to put in our tracking structures
        ptr = d_ptr;
    }

    QMutexLocker lock(&kp->mutex);
    Q_ASSERT(!kp->dPointers.contains(d_ptr));

    //qDebug("Adding d=%p value=%p", d_ptr, ptr);

    const void *other_d_ptr = kp->dataPointers.value(ptr, nullptr);
    if (Q_UNLIKELY(other_d_ptr)) {
#  ifdef BACKTRACE_SUPPORTED
        printBacktrace(knownPointers()->dPointers.value(other_d_ptr).backtrace);
#  endif
        qFatal("QSharedPointer: internal self-check failed: pointer %p was already tracked "
               "by another QSharedPointer object %p", ptr, other_d_ptr);
    }

    Data data;
    data.pointer = ptr;
#  ifdef BACKTRACE_SUPPORTED
    data.backtrace = saveBacktrace();
#  endif

    kp->dPointers.insert(d_ptr, data);
    kp->dataPointers.insert(ptr, d_ptr);
    Q_ASSERT(kp->dPointers.size() == kp->dataPointers.size());
}